

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanojson3.h
# Opt level: O3

json * nanojson3::json::json_reader<const_char_*>::read_json
                 (json *__return_storage_ptr__,char *begin,char *end,json_parse_option loose_option)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  json_reader<const_char_*> local_58;
  
  local_58.input_.current_position_char_ = 0;
  local_58.input_.current_position_line_ = 0;
  local_58.input_.current_position_column_ = 0;
  paVar1 = &local_58.string_input_buffer_.field_2;
  local_58.input_.it_ = begin;
  local_58.input_.end_ = end;
  local_58.option_bits_ = loose_option;
  local_58.string_input_buffer_._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct((ulong)&local_58.string_input_buffer_,'\0');
  eat_utf8bom(&local_58);
  eat_whitespaces(&local_58);
  read_element(__return_storage_ptr__,&local_58);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58.string_input_buffer_._M_dataplus._M_p != paVar1) {
    operator_delete(local_58.string_input_buffer_._M_dataplus._M_p,
                    local_58.string_input_buffer_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

static json read_json(CharInputIterator begin, CharInputIterator end, json_parse_option loose_option)
        {
            return json_reader(begin, end, loose_option).execute();
        }